

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise.cpp
# Opt level: O2

int __thiscall
ncnn::ConvolutionDepthWise::forward
          (ConvolutionDepthWise *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  float fVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  size_t sVar6;
  void *pvVar7;
  void *pvVar8;
  float *pfVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  ulong uVar16;
  ulong uVar17;
  void *pvVar18;
  long lVar19;
  ulong uVar20;
  int _w;
  int iVar21;
  size_type __n;
  long lVar22;
  long lVar23;
  void *pvVar24;
  ulong uVar25;
  int iVar26;
  int j;
  ulong uVar27;
  long lVar28;
  long lVar29;
  ulong uVar30;
  float fVar31;
  int local_194;
  long local_188;
  void *local_180;
  int local_150;
  Mat m;
  Mat bottom_blob_bordered;
  vector<int,_std::allocator<int>_> _space_ofs;
  
  if ((opt->use_int8_inference == true) && ((this->weight_data).elemsize == 1)) {
    iVar10 = forward_int8(this,bottom_blob,top_blob,opt);
    return iVar10;
  }
  iVar10 = bottom_blob->c;
  local_150 = -100;
  if ((iVar10 % this->group == 0) && (this->num_output % this->group == 0)) {
    sVar6 = bottom_blob->elemsize;
    iVar12 = this->kernel_w;
    iVar21 = this->kernel_h;
    iVar3 = this->dilation_w;
    iVar4 = this->dilation_h;
    bottom_blob_bordered.elemsize._0_4_ = 0;
    bottom_blob_bordered.elemsize._4_4_ = 0;
    bottom_blob_bordered.elempack = 0;
    bottom_blob_bordered.data = (void *)0x0;
    bottom_blob_bordered.refcount._0_4_ = 0;
    bottom_blob_bordered.refcount._4_4_ = 0;
    bottom_blob_bordered.allocator = (Allocator *)0x0;
    bottom_blob_bordered.dims = 0;
    bottom_blob_bordered.w = 0;
    bottom_blob_bordered.h = 0;
    bottom_blob_bordered.c = 0;
    bottom_blob_bordered.cstep = 0;
    make_padding(this,bottom_blob,&bottom_blob_bordered,opt);
    local_150 = -100;
    if ((bottom_blob_bordered.data != (void *)0x0) &&
       ((long)bottom_blob_bordered.c * bottom_blob_bordered.cstep != 0)) {
      iVar5 = bottom_blob_bordered.w;
      iVar3 = (~((iVar12 + -1) * iVar3) + bottom_blob_bordered.w) / this->stride_w;
      iVar4 = (~((iVar21 + -1) * iVar4) + bottom_blob_bordered.h) / this->stride_h;
      uVar11 = this->kernel_w * this->kernel_h;
      __n = (size_type)(int)uVar11;
      std::vector<int,_std::allocator<int>_>::vector(&_space_ofs,__n,(allocator_type *)&m);
      _w = iVar3 + 1;
      iVar12 = this->dilation_h;
      iVar21 = this->kernel_w;
      iVar14 = this->dilation_w * iVar21;
      iVar26 = 0;
      lVar22 = 0;
      for (iVar15 = 0; iVar15 < this->kernel_h; iVar15 = iVar15 + 1) {
        for (lVar23 = 0; (int)lVar23 < iVar21; lVar23 = lVar23 + 1) {
          _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[(int)lVar22 + lVar23] = iVar26;
          iVar26 = iVar26 + this->dilation_w;
          iVar21 = this->kernel_w;
        }
        iVar26 = iVar26 + (iVar5 * iVar12 - iVar14);
        lVar22 = (int)lVar22 + lVar23;
      }
      Mat::create(top_blob,_w,iVar4 + 1,this->num_output,sVar6,opt->blob_allocator);
      local_150 = -100;
      if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
        iVar12 = this->group;
        if (iVar12 == this->num_output && iVar10 == iVar12) {
          local_150 = 0;
          uVar30 = 0;
          if (0 < (int)uVar11) {
            uVar30 = (ulong)uVar11;
          }
          local_188 = 0;
          for (lVar22 = 0; lVar22 < iVar10; lVar22 = lVar22 + 1) {
            Mat::channel(&m,top_blob,(int)lVar22);
            pvVar24 = m.data;
            Mat::~Mat(&m);
            pvVar7 = (this->weight_data).data;
            iVar10 = bottom_blob_bordered.w;
            sVar6 = CONCAT44(bottom_blob_bordered.elemsize._4_4_,
                             (undefined4)bottom_blob_bordered.elemsize);
            pvVar18 = (void *)(bottom_blob_bordered.cstep * lVar22 * sVar6 +
                              (long)bottom_blob_bordered.data);
            m.refcount = (int *)0x0;
            m.elempack = bottom_blob_bordered.elempack;
            m.allocator = bottom_blob_bordered.allocator;
            m.dims = 2;
            m.w = bottom_blob_bordered.w;
            m.h = bottom_blob_bordered.h;
            m.c = 1;
            m.cstep = (size_t)(bottom_blob_bordered.h * bottom_blob_bordered.w);
            m.data = pvVar18;
            m.elemsize = sVar6;
            for (iVar12 = 0; iVar12 <= iVar4; iVar12 = iVar12 + 1) {
              iVar21 = this->bias_term;
              iVar5 = this->activation_type;
              iVar14 = this->stride_h;
              pvVar8 = (this->bias_data).data;
              iVar15 = this->stride_w;
              pfVar9 = (float *)(this->activation_params).data;
              for (lVar23 = 0; lVar23 <= iVar3; lVar23 = lVar23 + 1) {
                if (iVar21 == 0) {
                  fVar31 = 0.0;
                }
                else {
                  fVar31 = *(float *)((long)pvVar8 + lVar22 * 4);
                }
                for (uVar16 = 0; uVar30 != uVar16; uVar16 = uVar16 + 1) {
                  fVar31 = fVar31 + *(float *)((long)pvVar7 + uVar16 * 4 + local_188) *
                                    *(float *)((long)pvVar18 +
                                              (long)_space_ofs.
                                                    super__Vector_base<int,_std::allocator<int>_>.
                                                    _M_impl.super__Vector_impl_data._M_start[uVar16]
                                              * 4 + lVar23 * iVar15 * 4 +
                                                    (long)(iVar12 * iVar10 * iVar14) * sVar6);
                }
                switch(iVar5) {
                case 1:
                  if (fVar31 <= 0.0) {
                    fVar31 = 0.0;
                  }
                  break;
                case 2:
                  fVar31 = fVar31 * (float)(~-(uint)(0.0 < fVar31) & (uint)*pfVar9 |
                                           -(uint)(0.0 < fVar31) & 0x3f800000);
                  break;
                case 3:
                  if (fVar31 <= *pfVar9) {
                    fVar31 = *pfVar9;
                  }
                  if (pfVar9[1] < fVar31) {
                    fVar31 = pfVar9[1];
                  }
                  break;
                case 4:
                  fVar31 = expf(-fVar31);
                  fVar31 = 1.0 / (fVar31 + 1.0);
                }
                *(float *)((long)pvVar24 + lVar23 * 4) = fVar31;
              }
              pvVar24 = (void *)((long)pvVar24 + (long)_w * 4);
            }
            Mat::~Mat(&m);
            iVar10 = this->group;
            local_188 = local_188 + __n * 4;
          }
        }
        else {
          uVar13 = this->num_output / iVar12;
          iVar21 = (int)((long)iVar10 / (long)iVar12);
          local_150 = 0;
          uVar30 = 0;
          if (0 < (int)uVar11) {
            uVar30 = (ulong)uVar11;
          }
          uVar16 = 0;
          if (0 < iVar21) {
            uVar16 = (long)iVar10 / (long)iVar12 & 0xffffffff;
          }
          uVar25 = 0;
          if (0 < (int)uVar13) {
            uVar25 = (ulong)uVar13;
          }
          local_194 = 0;
          for (lVar22 = 0; lVar22 < iVar12; lVar22 = lVar22 + 1) {
            lVar23 = (long)local_194 << 2;
            for (uVar20 = 0; uVar20 != uVar25; uVar20 = uVar20 + 1) {
              lVar19 = uVar20 + lVar22 * (int)uVar13;
              Mat::channel(&m,top_blob,(int)lVar19);
              local_180 = m.data;
              Mat::~Mat(&m);
              pvVar24 = (this->weight_data).data;
              for (iVar10 = 0; iVar10 <= iVar4; iVar10 = iVar10 + 1) {
                for (lVar29 = 0; lVar29 <= iVar3; lVar29 = lVar29 + 1) {
                  if (this->bias_term == 0) {
                    fVar31 = 0.0;
                  }
                  else {
                    fVar31 = *(float *)((long)(this->bias_data).data + lVar19 * 4);
                  }
                  lVar28 = (long)pvVar24 + lVar23;
                  for (uVar27 = 0; uVar27 != uVar16; uVar27 = uVar27 + 1) {
                    m.elemsize = CONCAT44(bottom_blob_bordered.elemsize._4_4_,
                                          (undefined4)bottom_blob_bordered.elemsize);
                    m.data = (void *)((lVar22 * iVar21 + uVar27) * bottom_blob_bordered.cstep *
                                      m.elemsize + (long)bottom_blob_bordered.data);
                    m.refcount = (int *)0x0;
                    m.elempack = bottom_blob_bordered.elempack;
                    m.allocator = bottom_blob_bordered.allocator;
                    m.dims = 2;
                    m.w = bottom_blob_bordered.w;
                    m.h = bottom_blob_bordered.h;
                    m.c = 1;
                    m.cstep = (size_t)(bottom_blob_bordered.h * bottom_blob_bordered.w);
                    for (uVar17 = 0; uVar30 != uVar17; uVar17 = uVar17 + 1) {
                      fVar31 = fVar31 + *(float *)(lVar28 + uVar17 * 4) *
                                        *(float *)((long)m.data +
                                                  (long)_space_ofs.
                                                                                                                
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start[uVar17] *
                                                  4 + (long)this->stride_w * (long)(int)lVar29 * 4 +
                                                      (long)(bottom_blob_bordered.w * iVar10 *
                                                            this->stride_h) * m.elemsize);
                    }
                    Mat::~Mat(&m);
                    lVar28 = lVar28 + __n * 4;
                  }
                  switch(this->activation_type) {
                  case 1:
                    if (fVar31 <= 0.0) {
                      fVar31 = 0.0;
                    }
                    break;
                  case 2:
                    fVar31 = fVar31 * (float)(~-(uint)(0.0 < fVar31) &
                                              *(this->activation_params).data |
                                             -(uint)(0.0 < fVar31) & 0x3f800000);
                    break;
                  case 3:
                    pfVar9 = (float *)(this->activation_params).data;
                    fVar1 = pfVar9[1];
                    fVar2 = *pfVar9;
                    if (fVar31 <= fVar2) {
                      fVar31 = fVar2;
                    }
                    if (fVar1 < fVar31) {
                      fVar31 = fVar1;
                    }
                    break;
                  case 4:
                    fVar31 = expf(-fVar31);
                    fVar31 = 1.0 / (fVar31 + 1.0);
                  }
                  *(float *)((long)local_180 + lVar29 * 4) = fVar31;
                }
                local_180 = (void *)((long)local_180 + (long)_w * 4);
              }
              lVar23 = lVar23 + (long)(int)(iVar21 * uVar11) * 4;
            }
            iVar12 = this->group;
            local_194 = local_194 + uVar13 * iVar21 * uVar11;
          }
        }
      }
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&_space_ofs.super__Vector_base<int,_std::allocator<int>_>);
    }
    Mat::~Mat(&bottom_blob_bordered);
  }
  return local_150;
}

Assistant:

int ConvolutionDepthWise::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // convolv with NxN kernel
    // value = value + bias

    if (opt.use_int8_inference && weight_data.elemsize == (size_t)1u)
    {
        return forward_int8(bottom_blob, top_blob, opt);
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    if (channels % group != 0 || num_output % group != 0)
    {
        // reject invalid group
        return -100;
    }

//     fprintf(stderr, "ConvolutionDepthWise input %d x %d  pad = %d %d  ksize=%d %d  stride=%d %d\n", w, h, pad_w, pad_h, kernel_w, kernel_h, stride_w, stride_h);

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = w * dilation_h - kernel_w * dilation_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2 += dilation_w;
            }
            p2 += gap;
        }
    }

    // float32
    top_blob.create(outw, outh, num_output, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // depth-wise
    if (channels == group && group == num_output)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g=0; g<group; g++)
        {
            float* outptr = top_blob.channel(g);
            const float* kptr = (const float*)weight_data + maxk * g;
            const Mat m = bottom_blob_bordered.channel(g);

            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    float sum = 0.f;

                    if (bias_term)
                        sum = bias_data[g];

                    const float* sptr = m.row(i*stride_h) + j*stride_w;

                    for (int k = 0; k < maxk; k++)
                    {
                        float val = sptr[ space_ofs[k] ];
                        float w = kptr[k];
                        sum += val * w;
                    }

                    if (activation_type == 1)
                    {
                        sum = std::max(sum, 0.f);
                    }
                    else if (activation_type == 2)
                    {
                        float slope = activation_params[0];
                        sum = sum > 0.f ? sum : sum * slope;
                    }
                    else if (activation_type == 3)
                    {
                        float min = activation_params[0];
                        float max = activation_params[1];
                        if (sum < min)
                            sum = min;
                        if (sum > max)
                            sum = max;
                    }
                    else if (activation_type == 4)
                    {
                        sum = static_cast<float>(1.f / (1.f + exp(-sum)));
                    }

                    outptr[j] = sum;
                }

                outptr += outw;
            }
        }
    }
    else
    {
        // group convolution
        const int channels_g = channels / group;
        const int num_output_g = num_output / group;

#ifdef _WIN32
        #pragma omp parallel for num_threads(opt.num_threads)
#else // _WIN32
        #pragma omp parallel for collapse(2) num_threads(opt.num_threads)
#endif // _WIN32
        for (int g=0; g<group; g++)
        {
            for (int p=0; p<num_output_g; p++)
            {
                float* outptr = top_blob.channel(g * num_output_g + p);
                const float* weight_data_ptr = (const float*)weight_data + maxk * channels_g * num_output_g * g;

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        float sum = 0.f;

                        if (bias_term)
                            sum = bias_data[num_output_g * g + p];

                        const float* kptr = weight_data_ptr + maxk * channels_g * p;

                        // channels_g
                        for (int q=0; q<channels_g; q++)
                        {
                            const Mat m = bottom_blob_bordered.channel(channels_g * g + q);
                            const float* sptr = m.row(i*stride_h) + j*stride_w;

                            for (int k = 0; k < maxk; k++)
                            {
                                float val = sptr[ space_ofs[k] ];
                                float w = kptr[k];
                                sum += val * w;
                            }

                            kptr += maxk;
                        }

                        if (activation_type == 1)
                        {
                            sum = std::max(sum, 0.f);
                        }
                        else if (activation_type == 2)
                        {
                            float slope = activation_params[0];
                            sum = sum > 0.f ? sum : sum * slope;
                        }
                        else if (activation_type == 3)
                        {
                            float min = activation_params[0];
                            float max = activation_params[1];
                            if (sum < min)
                                sum = min;
                            if (sum > max)
                                sum = max;
                        }
                        else if (activation_type == 4)
                        {
                            sum = static_cast<float>(1.f / (1.f + exp(-sum)));
                        }

                        outptr[j] = sum;
                    }

                    outptr += outw;
                }
            }
        }
    }

    return 0;
}